

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::update_peer_interest(torrent *this,bool was_finished)

{
  peer_connection *this_00;
  bool bVar1;
  uint uVar2;
  reference pppVar3;
  peer_connection *p;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_20;
  peer_iterator i;
  bool was_finished_local;
  torrent *this_local;
  
  i._M_current._7_1_ = was_finished;
  local_20._M_current = (peer_connection **)begin(this);
  while( true ) {
    p = (peer_connection *)end(this);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                        *)&p);
    if (!bVar1) break;
    pppVar3 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&local_20);
    this_00 = *pppVar3;
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&local_20);
    peer_connection::update_interest(this_00);
  }
  bVar1 = anon_unknown_135::is_downloading_state
                    ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                           0x39) & 7);
  if (bVar1) {
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar2 & 1) != 0) {
      bVar1 = is_finished(this);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** UPDATE_PEER_INTEREST [ finished: %d was_finished %d ]",(ulong)bVar1,
                 (ulong)(i._M_current._7_1_ & 1));
    }
    if (((i._M_current._7_1_ & 1) == 0) && (bVar1 = is_finished(this), bVar1)) {
      finished(this);
    }
    else if (((i._M_current._7_1_ & 1) != 0) && (bVar1 = is_finished(this), !bVar1)) {
      resume_download(this);
    }
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** UPDATE_PEER_INTEREST [ skipping, state: %d ]",
               (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                             0x39) & 7));
  }
  return;
}

Assistant:

void torrent::update_peer_interest(bool const was_finished)
	{
		for (auto i = begin(); i != end();)
		{
			peer_connection* p = *i;
			// update_interest may disconnect the peer and
			// invalidate the iterator
			++i;
			p->update_interest();
		}

		if (!is_downloading_state(m_state))
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** UPDATE_PEER_INTEREST [ skipping, state: %d ]"
				, int(m_state));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** UPDATE_PEER_INTEREST [ finished: %d was_finished %d ]"
				, is_finished(), was_finished);
		}
#endif

		// the torrent just became finished
		if (!was_finished && is_finished())
		{
			finished();
		}
		else if (was_finished && !is_finished())
		{
			// if we used to be finished, but we aren't anymore
			// we may need to connect to peers again
			resume_download();
		}
	}